

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
          (type_caster_generic *this,handle src,bool convert)

{
  byte bVar1;
  PyTypeObject *t;
  undefined8 *puVar2;
  pointer pp_Var3;
  pointer pp_Var4;
  pointer pp_Var5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var9;
  type_info *ptVar10;
  pointer pp_Var11;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  undefined8 *puVar12;
  pointer pp_Var13;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar14;
  object local_50 [3];
  PyTypeObject *in_stack_ffffffffffffffc8;
  
  if (this->typeinfo == (type_info *)0x0 || src.m_ptr == (PyObject *)0x0) {
    return false;
  }
  if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    if (convert) {
      this->value = (void *)0x0;
      return true;
    }
    return false;
  }
  t = (src.m_ptr)->ob_type;
  if (t == this->typeinfo->type) {
LAB_0011ab1e:
    instance::get_value_and_holder
              ((value_and_holder *)local_50,(instance *)src.m_ptr,(type_info *)0x0);
LAB_0011ab34:
    this->value = (void *)(in_stack_ffffffffffffffc8->ob_base).ob_base.ob_refcnt;
    return true;
  }
  iVar7 = PyType_IsSubtype(t);
  if (iVar7 == 0) {
    if (!convert) {
      return false;
    }
  }
  else {
    pVar14 = all_type_info_get_cache(in_stack_ffffffffffffffc8);
    _Var9 = pVar14.first.
            super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
            ._M_cur;
    if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      all_type_info_populate
                (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    *)((long)_Var9.
                             super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                             ._M_cur + 0x10));
    }
    bVar1 = this->typeinfo->field_0x80;
    puVar12 = *(undefined8 **)
               ((long)_Var9.
                      super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                      ._M_cur + 0x10);
    puVar2 = *(undefined8 **)
              ((long)_Var9.
                     super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                     ._M_cur + 0x18);
    if ((long)puVar2 - (long)puVar12 == 8) {
      if (((bVar1 & 1) != 0) || (*(PyTypeObject **)*puVar12 == this->typeinfo->type))
      goto LAB_0011ab1e;
    }
    else if (puVar12 != puVar2 && 8 < (ulong)((long)puVar2 - (long)puVar12)) {
      do {
        ptVar10 = (type_info *)*puVar12;
        if ((bVar1 & 1) == 0) {
          uVar8 = (uint)(ptVar10->type == this->typeinfo->type);
        }
        else {
          uVar8 = PyType_IsSubtype();
        }
        if (uVar8 != 0) {
          instance::get_value_and_holder((value_and_holder *)local_50,(instance *)src.m_ptr,ptVar10)
          ;
          goto LAB_0011ab34;
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar2);
    }
    bVar6 = try_implicit_casts(this,src,convert);
    if (!convert || bVar6) {
      return bVar6;
    }
  }
  ptVar10 = this->typeinfo;
  pp_Var13 = (ptVar10->implicit_conversions).
             super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pp_Var3 = (ptVar10->implicit_conversions).
            super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pp_Var13 != pp_Var3) {
    do {
      local_50[0].super_handle.m_ptr = (handle)(**pp_Var13)(src.m_ptr,this->typeinfo->type);
      object::operator=(&this->temp,local_50);
      object::~object(local_50);
      bVar6 = load_impl<pybind11::detail::type_caster_generic>
                        (this,(this->temp).super_handle.m_ptr,false);
      if (bVar6) {
        return true;
      }
      pp_Var13 = pp_Var13 + 1;
    } while (pp_Var13 != pp_Var3);
    ptVar10 = this->typeinfo;
  }
  pp_Var4 = (ptVar10->direct_conversions->
            super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pp_Var5 = (ptVar10->direct_conversions->
            super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pp_Var4 == pp_Var5) {
    return false;
  }
  do {
    pp_Var11 = pp_Var4 + 1;
    bVar6 = (**pp_Var4)(src.m_ptr,&this->value);
    if (bVar6) {
      return bVar6;
    }
    pp_Var4 = pp_Var11;
  } while (pp_Var11 != pp_Var5);
  return bVar6;
}

Assistant:

PYBIND11_NOINLINE bool load_impl(handle src, bool convert) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            // Defer accepting None to other overloads (if we aren't in convert mode):
            if (!convert) return false;
            value = nullptr;
            return true;
        }

        auto &this_ = static_cast<ThisT &>(*this);
        this_.check_holder_compat();

        PyTypeObject *srctype = Py_TYPE(src.ptr());

        // Case 1: If src is an exact type match for the target type then we can reinterpret_cast
        // the instance's value pointer to the target type:
        if (srctype == typeinfo->type) {
            this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
            return true;
        }
        // Case 2: We have a derived class
        else if (PyType_IsSubtype(srctype, typeinfo->type)) {
            auto &bases = all_type_info(srctype);
            bool no_cpp_mi = typeinfo->simple_type;

            // Case 2a: the python type is a Python-inherited derived class that inherits from just
            // one simple (no MI) pybind11 class, or is an exact match, so the C++ instance is of
            // the right type and we can use reinterpret_cast.
            // (This is essentially the same as case 2b, but because not using multiple inheritance
            // is extremely common, we handle it specially to avoid the loop iterator and type
            // pointer lookup overhead)
            if (bases.size() == 1 && (no_cpp_mi || bases.front()->type == typeinfo->type)) {
                this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
                return true;
            }
            // Case 2b: the python type inherits from multiple C++ bases.  Check the bases to see if
            // we can find an exact match (or, for a simple C++ type, an inherited match); if so, we
            // can safely reinterpret_cast to the relevant pointer.
            else if (bases.size() > 1) {
                for (auto base : bases) {
                    if (no_cpp_mi ? PyType_IsSubtype(base->type, typeinfo->type) : base->type == typeinfo->type) {
                        this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder(base));
                        return true;
                    }
                }
            }

            // Case 2c: C++ multiple inheritance is involved and we couldn't find an exact type match
            // in the registered bases, above, so try implicit casting (needed for proper C++ casting
            // when MI is involved).
            if (this_.try_implicit_casts(src, convert))
                return true;
        }

        // Perform an implicit conversion
        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load_impl<ThisT>(temp, false))
                    return true;
            }
            if (this_.try_direct_conversions(src))
                return true;
        }
        return false;
    }